

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[16],unsigned_char&>
          (String *__return_storage_ptr__,kj *this,char (*params) [16],uchar *params_1)

{
  char (*value) [16];
  uchar *value_00;
  CappedArray<char,_5UL> CVar1;
  char *local_50;
  undefined4 local_48;
  char cStack_44;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  char (*local_20) [16];
  uchar *params_local_1;
  char (*params_local) [16];
  
  local_20 = params;
  params_local_1 = (uchar *)this;
  params_local = (char (*) [16])__return_storage_ptr__;
  value = ::const((char (*) [16])this);
  local_30 = toCharSequence<char_const(&)[16]>(value);
  value_00 = fwd<unsigned_char&>((uchar *)local_20);
  CVar1 = toCharSequence<unsigned_char&>(value_00);
  local_50 = (char *)CVar1.currentSize;
  local_40.ptr = local_50;
  local_48 = CVar1.content._0_4_;
  local_40.size_._0_4_ = local_48;
  cStack_44 = CVar1.content[4];
  local_40.size_._4_1_ = cStack_44;
  _::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,5ul>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,(CappedArray<char,_5UL> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}